

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,basic_string_view<wchar_t> value)

{
  size_t in_RCX;
  error_handler local_19;
  
  if (this->specs_ == (format_specs *)0x0) {
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::write
              (&this->writer_,(int)value.data_,(void *)value.size_,in_RCX);
  }
  else {
    check_string_type_spec<char,fmt::v6::internal::error_handler>(this->specs_->type,&local_19);
    basic_writer<fmt::v6::buffer_range<wchar_t>_>::write<wchar_t>(&this->writer_,value,this->specs_)
    ;
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }